

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  long lVar1;
  ZSTD_format_e format;
  byte bVar2;
  char cVar3;
  size_t sVar4;
  ZSTD_DDict *pZVar5;
  ZSTD_DDict *len;
  unsigned_long_long uVar6;
  uint *__src;
  ZSTD_DDict *pZVar7;
  ZSTD_DDict *__n;
  ZSTD_DDict *pZVar8;
  void *pvVar9;
  ZSTD_DDict *unaff_RBP;
  void *pvVar10;
  ZSTD_DDict *pZVar11;
  ZSTD_DDict *pZVar12;
  uint uVar13;
  int iVar14;
  bool bVar16;
  BYTE *ostart;
  uint local_64;
  ZSTD_DDict *pZVar15;
  
  if (ddict != (ZSTD_DDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("dict==NULL || ddict==NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5c5f,
                  "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                 );
  }
  if (ddict != (ZSTD_DDict *)0x0) {
    dict = ddict->dictContent;
    dictSize = ddict->dictSize;
  }
  bVar2 = 0;
  pvVar9 = dst;
  do {
    if (ZSTD_f_zstd1_magicless < dctx->format) {
      __assert_fail("(format == ZSTD_f_zstd1) || (format == ZSTD_f_zstd1_magicless)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5a00,"size_t ZSTD_startingInputLength(ZSTD_format_e)");
    }
    do {
      if (srcSize < (ZSTD_DDict *)((ulong)(dctx->format == ZSTD_f_zstd1) * 4 + 1)) {
        if ((ZSTD_DDict *)srcSize != (ZSTD_DDict *)0x0) {
          return 0xffffffffffffffb8;
        }
        return (long)pvVar9 - (long)dst;
      }
      iVar14 = 0;
      pZVar7 = unaff_RBP;
      if ((*src & 0xfffffff0) == 0x184d2a50) {
        pZVar7 = (ZSTD_DDict *)0xffffffffffffffb8;
        if ((ZSTD_DDict *)0x7 < srcSize) {
          pZVar7 = (ZSTD_DDict *)0xfffffffffffffff2;
          if ((*(uint *)((long)src + 4) >> 3 < 0x1fffffff) &&
             (pZVar7 = (ZSTD_DDict *)((ulong)*(uint *)((long)src + 4) + 8), srcSize < pZVar7)) {
            pZVar7 = (ZSTD_DDict *)0xffffffffffffffb8;
          }
        }
        iVar14 = 1;
        if (pZVar7 < (ZSTD_DDict *)0xffffffffffffff89) {
          bVar16 = srcSize < pZVar7;
          srcSize = srcSize - (long)pZVar7;
          if (bVar16) {
            __assert_fail("skippableSize <= srcSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x5c84,
                          "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                         );
          }
          src = (void *)((long)src + (long)pZVar7);
          iVar14 = 2;
          pZVar7 = unaff_RBP;
        }
      }
      unaff_RBP = pZVar7;
    } while (iVar14 == 2);
    if (iVar14 != 0) {
      return (size_t)pZVar7;
    }
    if (ddict == (ZSTD_DDict *)0x0) {
      sVar4 = ZSTD_decompressBegin_usingDict(dctx,dict,dictSize);
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
    }
    else {
      ZSTD_decompressBegin_usingDDict(dctx,ddict);
    }
    pvVar10 = dctx->previousDstEnd;
    if (pvVar10 != pvVar9) {
      dctx->dictEnd = pvVar10;
      dctx->virtualStart = (void *)(((long)dctx->prefixStart - (long)pvVar10) + (long)pvVar9);
      dctx->prefixStart = pvVar9;
      dctx->previousDstEnd = pvVar9;
    }
    format = dctx->format;
    if (srcSize < (ZSTD_DDict *)((ulong)(format == ZSTD_f_zstd1) * 4 + 5)) {
      unaff_RBP = (ZSTD_DDict *)0xffffffffffffffb8;
    }
    else {
      pZVar5 = (ZSTD_DDict *)
               ZSTD_frameHeaderSize_internal(src,(ulong)(format == ZSTD_f_zstd1) * 4 + 1,format);
      unaff_RBP = pZVar5;
      if (pZVar5 < (ZSTD_DDict *)0xffffffffffffff89) {
        if (srcSize < (ZSTD_DDict *)((long)&pZVar5->dictBuffer + 3U)) {
          unaff_RBP = (ZSTD_DDict *)0xffffffffffffffb8;
          goto LAB_00166306;
        }
        unaff_RBP = (ZSTD_DDict *)ZSTD_decodeFrameHeader(dctx,src,(size_t)pZVar5);
        if ((ZSTD_DDict *)0xffffffffffffff88 < unaff_RBP) goto LAB_00166306;
        __src = (uint *)((long)src + (long)(&pZVar5->entropy + -1) + 0x6810);
        pZVar5 = (ZSTD_DDict *)(srcSize - (long)pZVar5);
        bVar16 = true;
      }
      else {
LAB_00166306:
        bVar16 = false;
        __src = (uint *)src;
        pZVar5 = (ZSTD_DDict *)srcSize;
      }
      if (bVar16) {
        lVar1 = (long)pvVar9 + dstCapacity;
        pZVar8 = unaff_RBP;
        pvVar10 = pvVar9;
        pZVar12 = ddict;
        pZVar15 = (ZSTD_DDict *)dict;
        do {
          unaff_RBP = (ZSTD_DDict *)0xffffffffffffffb8;
          if ((ZSTD_DDict *)0x2 < pZVar5) {
            pZVar12 = (ZSTD_DDict *)(ulong)(uint3)((uint3)*__src >> 3);
            local_64 = (ushort)*__src & 1;
            uVar13 = (ushort)((ushort)*__src >> 1) & 3;
            pZVar15 = (ZSTD_DDict *)(ulong)uVar13;
            unaff_RBP = pZVar15;
            if ((uVar13 != 1) && (unaff_RBP = pZVar12, uVar13 == 3)) {
              unaff_RBP = (ZSTD_DDict *)0xffffffffffffffec;
            }
          }
          cVar3 = '\x01';
          if (unaff_RBP < (ZSTD_DDict *)0xffffffffffffff89) {
            __src = (uint *)((long)__src + 3);
            pZVar5 = (ZSTD_DDict *)((long)&pZVar5[-1].cMem.opaque + 5);
            pZVar11 = (ZSTD_DDict *)((long)pZVar5 - (long)unaff_RBP);
            if (pZVar5 < unaff_RBP) {
              unaff_RBP = (ZSTD_DDict *)0xffffffffffffffb8;
            }
            else {
              iVar14 = (int)pZVar15;
              if (iVar14 == 0) {
                if (pvVar10 == (void *)0x0) {
                  len = (ZSTD_DDict *)0xffffffffffffffb6;
                  if (unaff_RBP == (ZSTD_DDict *)0x0) {
                    len = unaff_RBP;
                  }
                }
                else {
                  len = (ZSTD_DDict *)0xffffffffffffffba;
                  if (unaff_RBP <= (ZSTD_DDict *)(lVar1 - (long)pvVar10)) {
                    memcpy(pvVar10,__src,(size_t)unaff_RBP);
                    len = unaff_RBP;
                  }
                }
              }
              else if (iVar14 == 1) {
                if (pvVar10 == (void *)0x0) {
                  len = (ZSTD_DDict *)0xffffffffffffffb6;
                  if ((int)pZVar12 == 0) {
                    len = (ZSTD_DDict *)0x0;
                  }
                }
                else {
                  __n = (ZSTD_DDict *)((ulong)pZVar12 & 0xffffffff);
                  len = (ZSTD_DDict *)0xffffffffffffffba;
                  if (__n <= (ZSTD_DDict *)(lVar1 - (long)pvVar10)) {
                    memset(pvVar10,(uint)*(byte *)__src,(size_t)__n);
                    len = __n;
                  }
                }
              }
              else {
                if (iVar14 != 2) {
                  unaff_RBP = (ZSTD_DDict *)0xffffffffffffffec;
                  goto LAB_001663b7;
                }
                len = (ZSTD_DDict *)
                      ZSTD_decompressBlock_internal
                                (dctx,pvVar10,lVar1 - (long)pvVar10,__src,(size_t)unaff_RBP,1);
              }
              if (len < (ZSTD_DDict *)0xffffffffffffff89) {
                if ((dctx->fParams).checksumFlag != 0) {
                  ZSTD_XXH64_update(&dctx->xxhState,pvVar10,(size_t)len);
                }
                pvVar10 = (void *)((long)pvVar10 + (long)len);
                __src = (uint *)((long)__src + (long)unaff_RBP);
                cVar3 = (local_64 != 0) * '\x05';
                unaff_RBP = pZVar8;
                pZVar5 = pZVar11;
              }
              else {
                cVar3 = '\x01';
                unaff_RBP = len;
              }
            }
          }
LAB_001663b7:
          pZVar8 = unaff_RBP;
        } while (cVar3 == '\0');
        if (cVar3 == '\x05') {
          pZVar8 = (ZSTD_DDict *)(dctx->fParams).frameContentSize;
          if ((pZVar8 == (ZSTD_DDict *)0xffffffffffffffff) ||
             ((ZSTD_DDict *)((long)pvVar10 - (long)pvVar9) == pZVar8)) {
            if ((dctx->fParams).checksumFlag != 0) {
              pZVar8 = (ZSTD_DDict *)0xffffffffffffffea;
              if (pZVar5 < (ZSTD_DDict *)0x4) {
                bVar16 = false;
              }
              else {
                uVar6 = ZSTD_XXH64_digest(&dctx->xxhState);
                if (*__src == (uint)uVar6) {
                  __src = __src + 1;
                  pZVar5 = (ZSTD_DDict *)((long)&pZVar5[-1].cMem.opaque + 4);
                  bVar16 = true;
                  pZVar8 = unaff_RBP;
                }
                else {
                  bVar16 = false;
                }
              }
              unaff_RBP = pZVar8;
              if (!bVar16) goto LAB_001666ae;
            }
            unaff_RBP = (ZSTD_DDict *)((long)pvVar10 - (long)pvVar9);
            srcSize = (size_t)pZVar5;
            src = __src;
          }
          else {
            unaff_RBP = (ZSTD_DDict *)0xffffffffffffffec;
          }
        }
      }
    }
LAB_001666ae:
    if ((bool)(bVar2 & ((int)unaff_RBP == -10 && (ZSTD_DDict *)0xffffffffffffff88 < unaff_RBP))) {
      bVar16 = false;
      unaff_RBP = (ZSTD_DDict *)0xffffffffffffffb8;
    }
    else if (unaff_RBP < (ZSTD_DDict *)0xffffffffffffff89) {
      bVar16 = dstCapacity < unaff_RBP;
      dstCapacity = dstCapacity - (long)unaff_RBP;
      if (bVar16) {
        __assert_fail("res <= dstCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x5ca5,
                      "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                     );
      }
      pvVar9 = (void *)((long)pvVar9 + (long)unaff_RBP);
      bVar16 = true;
      unaff_RBP = pZVar7;
    }
    else {
      bVar16 = false;
    }
    bVar2 = 1;
    if (!bVar16) {
      return (size_t)unaff_RBP;
    }
  } while( true );
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_startingInputLength(dctx->format)) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <=- dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (unsigned)magicNumber, ZSTD_MAGICNUMBER);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize);
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict));
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize));
        }
        ZSTD_checkContinuity(dctx, dst);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "at least one frame successfully completed, but following "
                "bytes are garbage: it's more likely to be a srcSize error, "
                "specifying more bytes than compressed size of frame(s). This "
                "error message replaces ERROR(prefix_unknown), which would be "
                "confusing, as the first header is actually correct. Note that "
                "one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic "
                "bytes. But this is _much_ less likely than a srcSize field "
                "error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            if (res != 0)
                dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (BYTE*)dst - (BYTE*)dststart;
}